

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_asphyxiate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *in_RCX;
  long in_RDX;
  int in_R8D;
  int dam;
  CHAR_DATA *victim;
  undefined1 in_stack_00001322;
  undefined1 in_stack_00001323;
  int in_stack_00001324;
  int in_stack_00001328;
  int in_stack_0000132c;
  CHAR_DATA *in_stack_00001330;
  CHAR_DATA *in_stack_00001338;
  int in_stack_00001358;
  int in_stack_00001360;
  char *in_stack_00001368;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  int level_00;
  
  dice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if ((*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) == 0) ||
     (*(short *)(*(long *)(in_RDX + 0xa8) + 0x150) != 8)) {
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    level_00 = (int)in_RDX;
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    act(in_stack_ffffffffffffffc0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
        (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
        (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    saves_spell(level_00,in_RCX,in_R8D);
    damage_new(in_stack_00001338,in_stack_00001330,in_stack_0000132c,in_stack_00001328,
               in_stack_00001324,(bool)in_stack_00001323,(bool)in_stack_00001322,in_stack_00001358,
               in_stack_00001360,in_stack_00001368);
  }
  else {
    send_to_char(in_stack_ffffffffffffffc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void spell_asphyxiate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam = dice(level, 5);

	if (ch->in_room->sector_type && ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this here.\n\r", ch);
		return;
	}

	act("$N gasps as you corrupt the air $E is breathing!", ch, 0, victim, TO_CHAR);
	act("You gasp as $n corrupts the air you are breathing!", ch, 0, victim, TO_VICT);
	act("$N gasps as $n corrupts the air $E is breathing!", ch, 0, victim, TO_NOTVICT);

	if (saves_spell(level, victim, DAM_INTERNAL))
		dam /= 2;

	damage_new(ch, victim, dam, sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
}